

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool ORPG::Utils::print_file(string *type)

{
  byte bVar1;
  string screen_disp;
  string local_50;
  string local_30;
  
  bVar1 = Core::QUIET_FLAG;
  if (Core::QUIET_FLAG == 0) {
    std::__cxx11::string::string((string *)&local_50,(string *)type);
    get_display_screen(&local_30,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    puts(local_30._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool print_file(string type) {
            if(Core::QUIET_FLAG) return false;

            string screen_disp = get_display_screen(type);
            printf("%s\n", screen_disp.c_str());

            return true;
        }